

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Attribute *pAVar1;
  bool bVar2;
  char **argv_00;
  pointer pHVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ostream *poVar8;
  Header *pHVar9;
  size_t sVar10;
  undefined8 *puVar11;
  invalid_argument *this;
  code *check;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  uint uVar15;
  bool bVar16;
  int part;
  int i;
  MultiPartInputFile in;
  SetAttrVector attrs;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  MultiPartOutputFile out;
  DeepTiledOutputPart outPart;
  DeepTiledInputPart inPart;
  int local_108;
  bool local_101;
  char **local_100;
  char *local_f8;
  int local_ec;
  char *local_e8;
  ulong local_e0;
  undefined8 local_d8;
  int local_cc;
  MultiPartInputFile local_c8 [16];
  SetAttrVector local_b8;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_98;
  Header local_78 [56];
  DeepTiledOutputPart local_40 [8];
  DeepTiledInputPart local_38 [8];
  
  if (argc < 2) {
    usageMessage((ostream *)&std::cerr,*argv,false);
    return 1;
  }
  local_b8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_b8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_108 = -1;
  local_ec = 1;
  local_e8 = (char *)0x0;
  local_f8 = (char *)0x0;
  local_100 = argv;
  do {
    iVar5 = local_ec;
    argv_00 = local_100;
    if (argc <= local_ec) {
      if (local_f8 == (char *)0x0) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Missing input filename");
      }
      else if (local_e8 == (char *)0x0) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Missing input filename");
      }
      else {
        iVar5 = strcmp(local_f8,local_e8);
        if (iVar5 != 0) {
          iVar5 = Imf_3_2::globalThreadCount();
          Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_c8,local_f8,iVar5,true);
          uVar6 = Imf_3_2::MultiPartInputFile::parts();
          local_e0 = (ulong)uVar6;
          local_98.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
          super__Vector_impl_data._M_start = (Header *)0x0;
          local_98.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_98.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_101 = 0 < (int)uVar6;
          if ((int)uVar6 < 1) {
            local_d8 = 0;
            goto LAB_00105e71;
          }
          local_cc = uVar6 - 1;
          local_d8 = 0;
          uVar15 = 0;
          goto LAB_00105c99;
        }
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(this,"Input and output cannot be the same file");
      }
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    pcVar7 = local_100[local_ec];
    pcVar13 = pcVar7;
    iVar4 = strcmp(pcVar7,"-part");
    if (iVar4 == 0) {
      bVar16 = true;
      getPart(pcVar13,argc,argv_00,&local_ec,&local_108);
    }
    else {
      pcVar13 = pcVar7 + 1;
      iVar4 = strcmp(pcVar7,"-chromaticities");
      if (iVar4 == 0) {
        bVar16 = true;
        getChromaticities(pcVar13,argc,local_100,&local_ec,local_108,&local_b8);
      }
      else {
        iVar4 = strcmp(pcVar7,"-whiteLuminance");
        if (iVar4 == 0) {
LAB_0010591e:
          bVar16 = true;
          getFloat(pcVar13,argc,local_100,&local_ec,local_108,&local_b8,
                   (_func_void_char_ptr_float *)0x0);
        }
        else {
          iVar4 = strcmp(pcVar7,"-adoptedNeutral");
          if (iVar4 == 0) {
LAB_0010596a:
            bVar16 = true;
            getV2f(pcVar13,argc,local_100,&local_ec,local_108,&local_b8,
                   (_func_void_char_ptr_V2f_ptr *)0x0);
          }
          else {
            iVar4 = strcmp(pcVar7,"-renderingTransform");
            if ((iVar4 != 0) && (iVar4 = strcmp(pcVar7,"-lookModTransform"), iVar4 != 0)) {
              iVar4 = strcmp(pcVar7,"-xDensity");
              check = isPositive;
              if (iVar4 == 0) goto LAB_00105990;
              iVar4 = strcmp(pcVar7,"-owner");
              if ((iVar4 != 0) && (iVar4 = strcmp(pcVar7,"-comments"), iVar4 != 0)) {
                iVar4 = strcmp(pcVar7,"-capDate");
                if (iVar4 == 0) {
                  bVar16 = true;
                  getString(pcVar13,argc,local_100,&local_ec,local_108,&local_b8,isDate);
                }
                else {
                  iVar4 = strcmp(pcVar7,"-utcOffset");
                  if ((((iVar4 == 0) || (iVar4 = strcmp(pcVar7,"-longitude"), iVar4 == 0)) ||
                      (iVar4 = strcmp(pcVar7,"-latitude"), iVar4 == 0)) ||
                     (iVar4 = strcmp(pcVar7,"-altitude"), iVar4 == 0)) goto LAB_0010591e;
                  iVar4 = strcmp(pcVar7,"-focus");
                  if (iVar4 == 0) {
                    bVar16 = true;
                    getPosFloatOrInf(pcVar13,argc,local_100,&local_ec,local_108,&local_b8);
                  }
                  else {
                    iVar4 = strcmp(pcVar7,"-expTime");
                    check = isPositive;
                    if (iVar4 != 0) {
                      iVar4 = strcmp(pcVar7,"-aperture");
                      check = isPositive;
                      if (iVar4 != 0) {
                        iVar4 = strcmp(pcVar7,"-isoSpeed");
                        check = isPositive;
                        if (iVar4 != 0) {
                          iVar4 = strcmp(pcVar7,"-envmap");
                          if (iVar4 == 0) {
                            bVar16 = true;
                            getEnvmap(pcVar13,argc,local_100,&local_ec,local_108,&local_b8);
                          }
                          else {
                            iVar4 = strcmp(pcVar7,"-framesPerSecond");
                            if (iVar4 == 0) {
                              bVar16 = true;
                              getRational(pcVar13,argc,local_100,&local_ec,local_108,&local_b8,
                                          (_func_void_char_ptr_Rational_ptr *)0x0);
                            }
                            else {
                              iVar4 = strcmp(pcVar7,"-keyCode");
                              if (iVar4 == 0) {
                                bVar16 = true;
                                getKeyCode(pcVar13,argc,local_100,&local_ec,local_108,&local_b8);
                              }
                              else {
                                iVar4 = strcmp(pcVar7,"-timeCode");
                                if (iVar4 != 0) {
                                  iVar4 = strcmp(pcVar7,"-wrapmodes");
                                  if (iVar4 == 0) goto LAB_00105944;
                                  iVar4 = strcmp(pcVar7,"-pixelAspectRatio");
                                  check = isPositive;
                                  if (iVar4 != 0) {
                                    iVar4 = strcmp(pcVar7,"-screenWindowWidth");
                                    check = isNonNegative;
                                    if (iVar4 != 0) {
                                      iVar4 = strcmp(pcVar7,"-screenWindowCenter");
                                      if (iVar4 == 0) goto LAB_0010596a;
                                      iVar4 = strcmp(pcVar7,"-string");
                                      if (iVar4 == 0) {
                                        bVar16 = true;
                                        getNameAndString(argc,local_100,&local_ec,local_108,
                                                         &local_b8);
                                      }
                                      else {
                                        iVar4 = strcmp(pcVar7,"-float");
                                        if (iVar4 == 0) {
                                          bVar16 = true;
                                          getNameAndFloat(argc,local_100,&local_ec,local_108,
                                                          &local_b8);
                                        }
                                        else {
                                          iVar4 = strcmp(pcVar7,"-int");
                                          if (iVar4 == 0) {
                                            bVar16 = true;
                                            getNameAndInt(argc,local_100,&local_ec,local_108,
                                                          &local_b8);
                                          }
                                          else {
                                            iVar4 = strcmp(pcVar7,"-h");
                                            if ((iVar4 == 0) ||
                                               (iVar4 = strcmp(pcVar7,"--help"), iVar4 == 0)) {
                                              usageMessage((ostream *)&std::cout,"exrstdattr",true);
                                            }
                                            else {
                                              iVar4 = strcmp(pcVar7,"--version");
                                              if (iVar4 != 0) {
                                                if (local_f8 == (char *)0x0) {
                                                  local_f8 = pcVar7;
                                                  pcVar7 = local_e8;
                                                }
                                                local_e8 = pcVar7;
                                                local_ec = iVar5 + 1;
                                                bVar16 = true;
                                                goto LAB_001059b0;
                                              }
                                              pcVar7 = (char *)Imf_3_2::getLibraryVersion();
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                         "exrstdattr (OpenEXR) ",0x15);
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,"3.2.0",5);
                                              iVar5 = strcmp(pcVar7,"3.2.0");
                                              if (iVar5 != 0) {
                                                std::__ostream_insert<char,std::char_traits<char>>
                                                          ((ostream *)&std::cout,"(OpenEXR version "
                                                           ,0x11);
                                                poVar8 = std::operator<<((ostream *)&std::cout,
                                                                         pcVar7);
                                                std::__ostream_insert<char,std::char_traits<char>>
                                                          (poVar8,")",1);
                                              }
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                         " https://openexr.com",0x14);
                                              std::endl<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout);
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                                                                                  
                                                  "Copyright (c) Contributors to the OpenEXR Project"
                                                  ,0x31);
                                              std::endl<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout);
                                              std::__ostream_insert<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout,
                                                         "License BSD-3-Clause",0x14);
                                              std::endl<char,std::char_traits<char>>
                                                        ((ostream *)&std::cout);
                                            }
                                            bVar16 = false;
                                          }
                                        }
                                      }
                                      goto LAB_001059b0;
                                    }
                                  }
                                  goto LAB_00105990;
                                }
                                bVar16 = true;
                                getTimeCode(pcVar13,argc,local_100,&local_ec,local_108,&local_b8);
                              }
                            }
                          }
                          goto LAB_001059b0;
                        }
                      }
                    }
LAB_00105990:
                    bVar16 = true;
                    getFloat(pcVar13,argc,local_100,&local_ec,local_108,&local_b8,check);
                  }
                }
                goto LAB_001059b0;
              }
            }
LAB_00105944:
            bVar16 = true;
            getString(pcVar13,argc,local_100,&local_ec,local_108,&local_b8,
                      (_func_void_char_ptr_char_ptr *)0x0);
          }
        }
      }
    }
LAB_001059b0:
  } while (bVar16);
  iVar5 = 0;
  goto LAB_00106078;
  while( true ) {
    std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back(&local_98,local_78);
    uVar6 = (uint)local_e0;
    Imf_3_2::Header::~Header(local_78);
    uVar15 = uVar15 + 1;
    local_101 = (int)uVar15 < (int)uVar6;
    if (uVar15 == uVar6) break;
LAB_00105c99:
    pHVar9 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_c8);
    Imf_3_2::Header::Header(local_78,pHVar9);
    bVar16 = local_b8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.
             super__Vector_impl_data._M_finish !=
             local_b8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (bVar16) {
      lVar14 = 0;
      uVar12 = 0;
      do {
        pAVar1 = (Attribute *)
                 ((long)&((local_b8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>._M_impl.
                           super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar14);
        uVar6 = *(uint *)((long)&(local_b8.super__Vector_base<SetAttr,_std::allocator<SetAttr>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->part + lVar14);
        if (uVar6 == 0xffffffff || uVar6 == uVar15) {
          bVar2 = true;
          Imf_3_2::Header::insert((string *)local_78,pAVar1);
        }
        else {
          bVar2 = true;
          if ((uint)local_e0 <= uVar6) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Invalid part number ",0x14);
            poVar8 = (ostream *)
                     std::ostream::operator<<((ostream *)&std::cerr,*(int *)(pAVar1 + 0x20));
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,". Part numbers in file ",0x17);
            pcVar7 = local_f8;
            sVar10 = strlen(local_f8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar7,sVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," go from 0 to ",0xe);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,local_cc);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,".",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            local_d8 = 1;
            bVar2 = false;
          }
        }
        if (!bVar2) break;
        uVar12 = uVar12 + 1;
        lVar14 = lVar14 + 0x30;
        bVar16 = uVar12 < (ulong)(((long)local_b8.
                                         super__Vector_base<SetAttr,_std::allocator<SetAttr>_>.
                                         _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_b8.
                                         super__Vector_base<SetAttr,_std::allocator<SetAttr>_>.
                                         _M_impl.super__Vector_impl_data._M_start >> 4) *
                                 -0x5555555555555555);
      } while (bVar16);
    }
    if (bVar16) {
      Imf_3_2::Header::~Header(local_78);
      uVar6 = (uint)local_e0;
      break;
    }
  }
LAB_00105e71:
  pHVar3 = local_98.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = (int)local_d8;
  if ((local_101 & 1U) == 0) {
    iVar5 = Imf_3_2::globalThreadCount();
    Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
              ((MultiPartOutputFile *)local_78,local_e8,pHVar3,uVar6,false,iVar5);
    if (0 < (int)uVar6) {
      iVar5 = 0;
      do {
        Imf_3_2::MultiPartInputFile::header((int)local_c8);
        puVar11 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
        sVar10 = puVar11[1];
        if ((sVar10 == _DAT_0010b2e0) &&
           ((sVar10 == 0 ||
            (iVar4 = bcmp((void *)*puVar11,Imf_3_2::SCANLINEIMAGE_abi_cxx11_,sVar10), iVar4 == 0))))
        {
          Imf_3_2::InputPart::InputPart((InputPart *)local_38,local_c8,iVar5);
          Imf_3_2::OutputPart::OutputPart
                    ((OutputPart *)local_40,(MultiPartOutputFile *)local_78,iVar5);
          Imf_3_2::OutputPart::copyPixels((InputPart *)local_40);
        }
        else if ((sVar10 == DAT_0010b300) &&
                ((sVar10 == 0 ||
                 (iVar4 = bcmp((void *)*puVar11,Imf_3_2::TILEDIMAGE_abi_cxx11_,sVar10), iVar4 == 0))
                )) {
          Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)local_38,local_c8,iVar5);
          Imf_3_2::TiledOutputPart::TiledOutputPart
                    ((TiledOutputPart *)local_40,(MultiPartOutputFile *)local_78,iVar5);
          Imf_3_2::TiledOutputPart::copyPixels((TiledInputPart *)local_40);
        }
        else if ((sVar10 == DAT_0010b320) &&
                ((sVar10 == 0 ||
                 (iVar4 = bcmp((void *)*puVar11,Imf_3_2::DEEPSCANLINE_abi_cxx11_,sVar10), iVar4 == 0
                 )))) {
          Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)local_38,local_c8,iVar5);
          Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
                    ((DeepScanLineOutputPart *)local_40,(MultiPartOutputFile *)local_78,iVar5);
          Imf_3_2::DeepScanLineOutputPart::copyPixels((DeepScanLineInputPart *)local_40);
        }
        else if ((sVar10 == DAT_0010b340) &&
                ((sVar10 == 0 ||
                 (iVar4 = bcmp((void *)*puVar11,Imf_3_2::DEEPTILE_abi_cxx11_,sVar10), iVar4 == 0))))
        {
          Imf_3_2::DeepTiledInputPart::DeepTiledInputPart(local_38,local_c8,iVar5);
          Imf_3_2::DeepTiledOutputPart::DeepTiledOutputPart
                    (local_40,(MultiPartOutputFile *)local_78,iVar5);
          Imf_3_2::DeepTiledOutputPart::copyPixels((DeepTiledInputPart *)local_40);
        }
        iVar5 = iVar5 + 1;
      } while ((uint)local_e0 != iVar5);
    }
    Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)local_78);
    iVar5 = 0;
  }
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&local_98);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_c8);
LAB_00106078:
  std::vector<SetAttr,_std::allocator<SetAttr>_>::~vector(&local_b8);
  return iVar5;
}

Assistant:

int
main (int argc, char** argv)
{
    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return 1;
    }

    try
    {
        const char* inFileName  = 0;
        const char* outFileName = 0;

        SetAttrVector attrs;
        int           part = -1;
        int           i    = 1;

        while (i < argc)
        {
            const char* attrName = argv[i] + 1;

            if (!strcmp (argv[i], "-part"))
            {
                getPart (attrName, argc, argv, i, part);
            }
            else if (!strcmp (argv[i], "-chromaticities"))
            {
                getChromaticities (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-whiteLuminance"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-adoptedNeutral"))
            {
                getV2f (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-renderingTransform"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-lookModTransform"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-xDensity"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-owner"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-comments"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-capDate"))
            {
                getString (attrName, argc, argv, i, part, attrs, isDate);
            }
            else if (!strcmp (argv[i], "-utcOffset"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-longitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-latitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-altitude"))
            {
                getFloat (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-focus"))
            {
                getPosFloatOrInf (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-expTime"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-aperture"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-isoSpeed"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-envmap"))
            {
                getEnvmap (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-framesPerSecond"))
            {
                getRational (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-keyCode"))
            {
                getKeyCode (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-timeCode"))
            {
                getTimeCode (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-wrapmodes"))
            {
                getString (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-pixelAspectRatio"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isPositive);
            }
            else if (!strcmp (argv[i], "-screenWindowWidth"))
            {
                getFloat (attrName, argc, argv, i, part, attrs, isNonNegative);
            }
            else if (!strcmp (argv[i], "-screenWindowCenter"))
            {
                getV2f (attrName, argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-string"))
            {
                getNameAndString (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-float"))
            {
                getNameAndFloat (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-int"))
            {
                getNameAndInt (argc, argv, i, part, attrs);
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                usageMessage (cout, "exrstdattr", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion();
            
                cout << "exrstdattr (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp(libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
                cout << "License BSD-3-Clause" << endl;

                return 0;
            }
            else
            {
                if (inFileName == 0)
                    inFileName = argv[i];
                else
                    outFileName = argv[i];

                i += 1;
            }
        }

        if (inFileName == 0)
            throw invalid_argument("Missing input filename");
        if (outFileName == 0)
            throw invalid_argument("Missing input filename");

        if (!strcmp (inFileName, outFileName))
            throw invalid_argument("Input and output cannot be the same file");

        //
        // Load the headers from the input file
        // and add attributes to the headers.
        //

        MultiPartInputFile in (inFileName);
        int                numParts = in.parts ();
        vector<Header>     headers;

        for (int part = 0; part < numParts; ++part)
        {
            Header h = in.header (part);

            for (size_t i = 0; i < attrs.size (); ++i)
            {
                const SetAttr& attr = attrs[i];

                if (attr.part == -1 || attr.part == part)
                {
                    h.insert (attr.name, *attr.attr);
                }
                else if (attr.part < 0 || attr.part >= numParts)
                {
                    cerr << "Invalid part number " << attr.part
                         << ". "
                            "Part numbers in file "
                         << inFileName
                         << " "
                            "go from 0 to "
                         << numParts - 1 << "." << endl;

                    return 1;
                }
            }

            headers.push_back (h);
        }

        //
        // Crete an output file with the modified headers,
        // and copy the pixels from the input file to the
        // output file.
        //

        MultiPartOutputFile out (outFileName, &headers[0], numParts);

        for (int p = 0; p < numParts; ++p)
        {
            const Header& h    = in.header (p);
            const string& type = h.type ();

            if (type == SCANLINEIMAGE)
            {
                InputPart  inPart (in, p);
                OutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == TILEDIMAGE)
            {
                TiledInputPart  inPart (in, p);
                TiledOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == DEEPSCANLINE)
            {
                DeepScanLineInputPart  inPart (in, p);
                DeepScanLineOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
            else if (type == DEEPTILE)
            {
                DeepTiledInputPart  inPart (in, p);
                DeepTiledOutputPart outPart (out, p);
                outPart.copyPixels (inPart);
            }
        }
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}